

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memops.c
# Opt level: O2

void dmrC_simplify_memops(dmr_C *C,entrypoint *ep)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  instruction *piVar4;
  instruction *piVar5;
  pseudo_t ppVar6;
  unsigned_long generation;
  undefined1 local_88 [8];
  ptr_list_iter bbiter__;
  undefined1 auStack_60 [8];
  ptr_list_iter insniter__;
  pseudo_list *dominators;
  
  ptrlist_reverse_iterator((ptr_list_iter *)local_88,(ptr_list *)ep->bbs);
  pvVar3 = ptrlist_iter_prev((ptr_list_iter *)local_88);
  do {
    if (pvVar3 == (void *)0x0) {
      ptrlist_reverse_iterator((ptr_list_iter *)local_88,(ptr_list *)ep->bbs);
      do {
        pvVar3 = ptrlist_iter_prev((ptr_list_iter *)local_88);
        if (pvVar3 == (void *)0x0) {
          return;
        }
        ptrlist_reverse_iterator((ptr_list_iter *)auStack_60,*(ptr_list **)((long)pvVar3 + 0x30));
LAB_0012eddc:
        piVar4 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_60);
      } while (piVar4 == (instruction *)0x0);
      if ((piVar4->bb != (basic_block *)0x0) && (*(char *)piVar4 == '*')) {
        ppVar6 = (piVar4->field_6).field_4.phi_src;
        iVar1 = local_pseudo(ppVar6);
        insniter__._16_8_ = auStack_60;
        while (piVar5 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)&insniter__.__nr),
              piVar5 != (instruction *)0x0) {
          if (piVar5->bb != (basic_block *)0x0) {
            iVar2 = dmrC_dominates(C,ppVar6,piVar4,piVar5,iVar1);
            if (iVar2 != 0) {
              if ((iVar2 < 0) || ((char)*(uint *)piVar5 == ')')) break;
              piVar5->bb = (basic_block *)0x0;
              *(uint *)piVar5 = *(uint *)piVar5 & 0xffffff00 | 0x39;
              dmrC_kill_use(C,&(piVar5->field_5).target);
            }
          }
        }
      }
      goto LAB_0012eddc;
    }
    bbiter__._16_8_ = pvVar3;
    ptrlist_reverse_iterator((ptr_list_iter *)auStack_60,*(ptr_list **)((long)pvVar3 + 0x30));
LAB_0012ec61:
    piVar4 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)auStack_60);
    if (piVar4 != (instruction *)0x0) {
      if ((piVar4->bb != (basic_block *)0x0) && (*(char *)piVar4 == ')')) {
        ppVar6 = (piVar4->field_6).field_4.phi_src;
        iVar1 = local_pseudo(ppVar6);
        dmrC_check_access(C,piVar4);
        if ((*(byte *)((long)&piVar4->type->field_14 + 0x18) & 0x20) == 0) {
          insniter__._16_8_ = auStack_60;
          do {
            do {
              do {
                piVar5 = (instruction *)ptrlist_iter_prev((ptr_list_iter *)&insniter__.__nr);
                if (piVar5 == (instruction *)0x0) {
                  generation = C->L->bb_generation + 1;
                  C->L->bb_generation = generation;
                  *(unsigned_long *)(bbiter__._16_8_ + 8) = generation;
                  insniter__.__nr = 0;
                  insniter__._20_4_ = 0;
                  iVar2 = find_dominating_parents
                                    (C,ppVar6,piVar4,(basic_block *)bbiter__._16_8_,generation,
                                     (pseudo_list **)&insniter__.__nr,iVar1);
                  if (iVar2 != 0) {
                    if (insniter__._16_8_ == 0) {
                      if (iVar1 != 0) {
                        if (ppVar6->type == PSEUDO_ARG) {
                          __assert_fail("pseudo->type != PSEUDO_ARG",
                                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/memops.c"
                                        ,0x80,
                                        "void simplify_loads(struct dmr_C *, struct basic_block *)")
                          ;
                        }
                        ppVar6 = dmrC_value_pseudo(C,piVar4->type,0);
                        dmrC_convert_load_instruction(C,piVar4,ppVar6);
                      }
                    }
                    else {
                      dmrC_rewrite_load_instruction(C,piVar4,(pseudo_list *)insniter__._16_8_);
                    }
                  }
                  goto LAB_0012ec61;
                }
              } while (piVar5->bb == (basic_block *)0x0);
              iVar2 = dmrC_dominates(C,ppVar6,piVar4,piVar5,iVar1);
            } while (iVar2 == 0);
            if (-1 < iVar2) {
              dmrC_convert_load_instruction(C,piVar4,(piVar5->field_5).target);
              break;
            }
          } while (*(char *)piVar5 == ')');
        }
      }
      goto LAB_0012ec61;
    }
    pvVar3 = ptrlist_iter_prev((ptr_list_iter *)local_88);
  } while( true );
}

Assistant:

void dmrC_simplify_memops(struct dmr_C *C, struct entrypoint *ep)
{
	struct basic_block *bb;

	FOR_EACH_PTR_REVERSE(ep->bbs, bb) {
		simplify_loads(C, bb);
	} END_FOR_EACH_PTR_REVERSE(bb);

	FOR_EACH_PTR_REVERSE(ep->bbs, bb) {
		kill_dominated_stores(C, bb);
	} END_FOR_EACH_PTR_REVERSE(bb);
}